

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::TestMutualRecursionA::Clear(TestMutualRecursionA *this)

{
  uint32_t *puVar1;
  LogMessage *pLVar2;
  LogMessage local_58;
  Voidify local_45 [20];
  byte local_31;
  LogMessage local_30;
  Voidify local_1d;
  uint local_1c;
  TestMutualRecursionA *pTStack_18;
  uint32_t cached_has_bits;
  TestMutualRecursionA *this_local;
  
  this_local = (TestMutualRecursionA *)&this->field_0;
  local_1c = 0;
  pTStack_18 = this;
  google::protobuf::RepeatedPtrField<proto2_unittest::TestMutualRecursionA_SubGroupR>::Clear
            (&(this->field_0)._impl_.subgroupr_);
  puVar1 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  local_1c = *puVar1;
  if ((local_1c & 3) != 0) {
    if ((local_1c & 1) != 0) {
      local_31 = 0;
      if ((this->field_0)._impl_.bb_ == (TestMutualRecursionB *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest.pb.cc"
                   ,0x5abe,"_impl_.bb_ != nullptr");
        local_31 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar2);
      }
      if ((local_31 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_30);
      }
      TestMutualRecursionB::Clear((this->field_0)._impl_.bb_);
    }
    if ((local_1c & 2) != 0) {
      if ((this->field_0)._impl_.subgroup_ == (TestMutualRecursionA_SubGroup *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_58,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest.pb.cc"
                   ,0x5ac2,"_impl_.subgroup_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
        absl::lts_20250127::log_internal::Voidify::operator&&(local_45,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_58);
      }
      TestMutualRecursionA_SubGroup::Clear((this->field_0)._impl_.subgroup_);
    }
  }
  google::protobuf::internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestMutualRecursionA::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestMutualRecursionA)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.subgroupr_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(_impl_.bb_ != nullptr);
      _impl_.bb_->Clear();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.subgroup_ != nullptr);
      _impl_.subgroup_->Clear();
    }
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}